

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O1

AssertionInfo * __thiscall
ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Iterator::operator*
          (Iterator *this)

{
  ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL> *pCVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->super_Iterator).nextTop == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x142,"(*this)","*this");
    if (!bVar3) goto LAB_00f0fb3c;
    *puVar4 = 0;
  }
  if ((this->stack->super_ContinuousPageStack<1UL>).nextTop < (this->super_Iterator).nextTop) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x143,"(this->nextTop <= stack.nextTop)","this->nextTop <= stack.nextTop");
    if (!bVar3) goto LAB_00f0fb3c;
    *puVar4 = 0;
  }
  pCVar1 = this->stack;
  if ((pCVar1->super_ContinuousPageStack<1UL>).bufferSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,199,"(bufferSize)","bufferSize");
    if (!bVar3) {
LAB_00f0fb3c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return (AssertionInfo *)
         ((long)&((pCVar1->super_ContinuousPageStack<1UL>).pageAllocation)->pageCount +
         (this->super_Iterator).nextTop);
}

Assistant:

inline T &ContinuousPageStackOfFixedElements<T, InitialPageCount>::Iterator::operator *() const
{
    Assert(*this);
    Assert(this->nextTop <= stack.nextTop);
    return *reinterpret_cast<T *>(&stack.Buffer()[this->nextTop - sizeof(T)]);
}